

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void udp_send_cack(udp_ep *ep,udp_pipe *p)

{
  udp_sp_msg local_1c;
  
  local_1c._0_2_ = 0x201;
  local_1c.data.us_type = p->proto;
  local_1c._4_4_ = p->self_id;
  local_1c._8_4_ = p->peer_id;
  local_1c.data.us_sequence = p->self_seq;
  p->self_seq = local_1c.data.us_sequence + 1;
  local_1c.data.us_length = p->rcvmax;
  local_1c.creq.us_refresh = (uint8_t)((p->refresh + 999) / 1000);
  udp_queue_tx(ep,&p->peer_addr,&local_1c,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_send_cack(udp_ep *ep, udp_pipe *p)
{
	udp_sp_cack cack;
	cack.us_ver       = 0x01;
	cack.us_op_code   = OPCODE_CACK;
	cack.us_type      = p->proto;
	cack.us_sender_id = p->self_id;
	cack.us_peer_id   = p->peer_id;
	cack.us_sequence  = p->self_seq++;
	cack.us_recv_max  = p->rcvmax;
	cack.us_refresh   = (p->refresh + NNI_SECOND - 1) / NNI_SECOND;
	udp_queue_tx(ep, &p->peer_addr, (void *) &cack, NULL);
}